

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::SetQuad(ON_Mesh *this,int face_index,int a,int b,int c,int d)

{
  int mesh_vertex_count;
  ON_MeshFace *pOVar1;
  undefined1 local_3c [8];
  ON_MeshFace f;
  int face_count;
  bool rc;
  int d_local;
  int c_local;
  int b_local;
  int a_local;
  int face_index_local;
  ON_Mesh *this_local;
  
  f.vi[3]._3_1_ = 0;
  f.vi[2] = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  if (-1 < face_index) {
    local_3c._0_4_ = a;
    local_3c._4_4_ = b;
    f.vi[0] = c;
    f.vi[1] = d;
    if (face_index < f.vi[2]) {
      pOVar1 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,face_index);
      *(ulong *)pOVar1->vi = CONCAT44(local_3c._4_4_,local_3c._0_4_);
      *(ulong *)(pOVar1->vi + 2) = CONCAT44(f.vi[1],f.vi[0]);
      f.vi[3]._3_1_ = 1;
    }
    else if (face_index == f.vi[2]) {
      ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,(ON_MeshFace *)local_3c);
      f.vi[3]._3_1_ = 1;
    }
    if ((f.vi[3]._3_1_ & 1) != 0) {
      mesh_vertex_count =
           ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      f.vi[3]._3_1_ = ON_MeshFace::IsValid((ON_MeshFace *)local_3c,mesh_vertex_count);
    }
  }
  return (bool)(f.vi[3]._3_1_ & 1);
}

Assistant:

bool ON_Mesh::SetQuad(
       int face_index,
       int a, int b, int c, int d // vertex indices
       )
{
  bool rc = false;
  int face_count = m_F.Count();
  if ( face_index >= 0 ) {
    ON_MeshFace f;
    f.vi[0] = a;
    f.vi[1] = b;
    f.vi[2] = c;
    f.vi[3] = d;
    if ( face_index < face_count ) {
      m_F[face_index] = f;
      rc = true;
    }
    else if ( face_index == face_count ) {
      m_F.Append(f);
      rc = true;
    }
    if ( rc )
      rc = f.IsValid(m_V.Count());
  }
  return rc;
}